

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void test_bhdct_get_in_many_string_key(planck_unit_test_t *tc)

{
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  char local_81 [8];
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  planck_unit_test_t *tc_local;
  
  memset(local_81,0,9);
  bhdct_setup_string_key
            (tc,(ion_dictionary_handler_t *)&dict.handler,(ion_dictionary_t *)(key + 1),
             ion_fill_none);
  sprintf(local_81,"k%d",0x23);
  local_88 = 0x46;
  bhdct_insert(tc,(ion_dictionary_t *)(key + 1),local_81,&local_88,'\x01');
  sprintf(local_81,"k%d",0x3ea);
  local_8c = 0x7d4;
  bhdct_insert(tc,(ion_dictionary_t *)(key + 1),local_81,&local_8c,'\x01');
  sprintf(local_81,"k%d",0x37);
  local_90 = 0x6e;
  bhdct_insert(tc,(ion_dictionary_t *)(key + 1),local_81,&local_90,'\x01');
  sprintf(local_81,"k%d",0xfffffffb);
  local_94 = 0xfffffff6;
  bhdct_insert(tc,(ion_dictionary_t *)(key + 1),local_81,&local_94,'\x01');
  bhdct_takedown(tc,(ion_dictionary_t *)(key + 1));
  return;
}

Assistant:

void
test_bhdct_get_in_many_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_none);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 35);
	bhdct_insert(tc, &dict, key, IONIZE(35 * 2, int), boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 1002);
	bhdct_insert(tc, &dict, key, IONIZE(1002 * 2, int), boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 55);
	bhdct_insert(tc, &dict, key, IONIZE(55 * 2, int), boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, -5);
	bhdct_insert(tc, &dict, key, IONIZE(-5 * 2, int), boolean_true);

	bhdct_takedown(tc, &dict);
}